

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O0

blargg_err_t __thiscall Gme_File::load(Gme_File *this,Data_Reader *in)

{
  blargg_err_t pcVar1;
  Gme_File *in_RSI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x30))();
  (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI);
  pcVar1 = post_load(in_RSI,(blargg_err_t)in_RDI);
  return pcVar1;
}

Assistant:

blargg_err_t Gme_File::load( Data_Reader& in )
{
	pre_load();
	return post_load( load_( in ) );
}